

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
* __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectFields
          (Interpreter *this,HeapObject *obj_,bool manifesting)

{
  bool bVar1;
  reference ppVar2;
  byte in_CL;
  value_type *in_RSI;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>,_bool> pVar3;
  pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide> *pair;
  iterator __end3;
  iterator __begin3;
  IdHideMap *__range3;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *r;
  HeapObject *in_stack_000000d0;
  Interpreter *in_stack_000000d8;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  _Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> in_stack_ffffffffffffff50;
  _Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> in_stack_ffffffffffffff70;
  _Self local_78;
  _Self local_70 [3];
  undefined1 local_58 [48];
  undefined1 *local_28;
  undefined1 local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  std::
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         *)0x2a86e1);
  objectFieldsAux(in_stack_000000d8,in_stack_000000d0);
  local_28 = local_58;
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
       ::begin((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
                *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  local_78._M_node =
       (_Base_ptr)
       std::
       map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
       ::end((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
              *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  while (bVar1 = std::operator!=(local_70,&local_78), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
                          *)0x2a876a);
    if (((local_19 & 1) == 0) || (ppVar2->second != HIDDEN)) {
      pVar3 = std::
              set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              ::insert((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                        *)in_stack_ffffffffffffff70._M_node,in_RSI);
      in_stack_ffffffffffffff50 = pVar3.first._M_node;
      in_stack_ffffffffffffff70._M_node = in_stack_ffffffffffffff50._M_node;
    }
    std::
    _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>
                  *)in_stack_ffffffffffffff50._M_node);
  }
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
  ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::ObjectField::Hide,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::ObjectField::Hide>_>_>
          *)0x2a8748);
  return in_RDI;
}

Assistant:

std::set<const Identifier *> objectFields(const HeapObject *obj_, bool manifesting)
    {
        std::set<const Identifier *> r;
        for (const auto &pair : objectFieldsAux(obj_)) {
            if (!manifesting || pair.second != ObjectField::HIDDEN)
                r.insert(pair.first);
        }
        return r;
    }